

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtob(StringPiece str,bool *value)

{
  StringPiece s2;
  StringPiece s2_00;
  StringPiece s2_01;
  StringPiece s2_02;
  StringPiece s2_03;
  StringPiece s2_04;
  StringPiece s2_05;
  StringPiece s2_06;
  StringPiece s2_07;
  StringPiece s2_08;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s1_03;
  StringPiece s1_04;
  StringPiece s1_05;
  StringPiece s1_06;
  StringPiece s1_07;
  StringPiece s1_08;
  bool bVar1;
  undefined1 *in_RDX;
  stringpiece_ssize_type in_RSI;
  char *in_RDI;
  LogMessage *in_stack_fffffffffffffe38;
  LogMessage *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  LogMessage *in_stack_fffffffffffffe50;
  stringpiece_ssize_type in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  stringpiece_ssize_type in_stack_fffffffffffffe68;
  LogMessage local_58;
  undefined1 *local_20;
  char *local_18;
  stringpiece_ssize_type local_10;
  
  local_20 = in_RDX;
  local_18 = in_RDI;
  local_10 = in_RSI;
  if (in_RDX == (undefined1 *)0x0) {
    in_stack_fffffffffffffe40 = &local_58;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffe50,(LogLevel)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (char *)in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    internal::LogMessage::operator<<(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 =
         internal::LogMessage::operator<<
                   (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    internal::LogMessage::~LogMessage((LogMessage *)0x43f79f);
  }
  StringPiece::StringPiece
            ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  s1.length_ = in_stack_fffffffffffffe68;
  s1.ptr_ = in_stack_fffffffffffffe60;
  s2.length_ = in_stack_fffffffffffffe58;
  s2.ptr_ = (char *)in_stack_fffffffffffffe50;
  bVar1 = CaseEqual(s1,s2);
  if (!bVar1) {
    StringPiece::StringPiece
              ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    s1_00.length_ = in_stack_fffffffffffffe68;
    s1_00.ptr_ = in_stack_fffffffffffffe60;
    s2_00.length_ = in_stack_fffffffffffffe58;
    s2_00.ptr_ = (char *)in_stack_fffffffffffffe50;
    bVar1 = CaseEqual(s1_00,s2_00);
    if (!bVar1) {
      StringPiece::StringPiece
                ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      s1_01.length_ = in_stack_fffffffffffffe68;
      s1_01.ptr_ = in_stack_fffffffffffffe60;
      s2_01.length_ = in_stack_fffffffffffffe58;
      s2_01.ptr_ = (char *)in_stack_fffffffffffffe50;
      bVar1 = CaseEqual(s1_01,s2_01);
      if (!bVar1) {
        StringPiece::StringPiece
                  ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        s1_02.length_ = in_stack_fffffffffffffe68;
        s1_02.ptr_ = in_stack_fffffffffffffe60;
        s2_02.length_ = in_stack_fffffffffffffe58;
        s2_02.ptr_ = (char *)in_stack_fffffffffffffe50;
        bVar1 = CaseEqual(s1_02,s2_02);
        if (!bVar1) {
          StringPiece::StringPiece
                    ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          s1_03.length_ = in_stack_fffffffffffffe68;
          s1_03.ptr_ = in_stack_fffffffffffffe60;
          s2_03.length_ = in_stack_fffffffffffffe58;
          s2_03.ptr_ = (char *)in_stack_fffffffffffffe50;
          bVar1 = CaseEqual(s1_03,s2_03);
          if (!bVar1) {
            StringPiece::StringPiece
                      ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
            s1_04.length_ = in_stack_fffffffffffffe68;
            s1_04.ptr_ = in_stack_fffffffffffffe60;
            s2_04.length_ = in_stack_fffffffffffffe58;
            s2_04.ptr_ = (char *)in_stack_fffffffffffffe50;
            bVar1 = CaseEqual(s1_04,s2_04);
            if (!bVar1) {
              StringPiece::StringPiece
                        ((StringPiece *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38)
              ;
              s1_05.length_ = in_stack_fffffffffffffe68;
              s1_05.ptr_ = in_stack_fffffffffffffe60;
              s2_05.length_ = in_stack_fffffffffffffe58;
              s2_05.ptr_ = (char *)in_stack_fffffffffffffe50;
              bVar1 = CaseEqual(s1_05,s2_05);
              if (!bVar1) {
                StringPiece::StringPiece
                          ((StringPiece *)in_stack_fffffffffffffe40,
                           (char *)in_stack_fffffffffffffe38);
                s1_06.length_ = in_stack_fffffffffffffe68;
                s1_06.ptr_ = in_stack_fffffffffffffe60;
                s2_06.length_ = in_stack_fffffffffffffe58;
                s2_06.ptr_ = (char *)in_stack_fffffffffffffe50;
                bVar1 = CaseEqual(s1_06,s2_06);
                if (!bVar1) {
                  StringPiece::StringPiece
                            ((StringPiece *)in_stack_fffffffffffffe40,
                             (char *)in_stack_fffffffffffffe38);
                  s1_07.length_ = in_stack_fffffffffffffe68;
                  s1_07.ptr_ = in_stack_fffffffffffffe60;
                  s2_07.length_ = in_stack_fffffffffffffe58;
                  s2_07.ptr_ = (char *)in_stack_fffffffffffffe50;
                  bVar1 = CaseEqual(s1_07,s2_07);
                  if (!bVar1) {
                    StringPiece::StringPiece
                              ((StringPiece *)in_stack_fffffffffffffe40,
                               (char *)in_stack_fffffffffffffe38);
                    s1_08.length_ = local_10;
                    s1_08.ptr_ = local_18;
                    s2_08.length_ = in_stack_fffffffffffffe58;
                    s2_08.ptr_ = (char *)in_stack_fffffffffffffe50;
                    bVar1 = CaseEqual(s1_08,s2_08);
                    if (!bVar1) {
                      return false;
                    }
                  }
                }
              }
            }
            *local_20 = 0;
            return true;
          }
        }
      }
    }
  }
  *local_20 = 1;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}